

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O1

float testinator::detail::Arbitrary_Arithmetic_Real<float>::generate
                (size_t generation,unsigned_long randomSeed)

{
  TestRegistry *pTVar1;
  long lVar2;
  ulong uVar3;
  float fVar4;
  
  if (generation < 4) {
    return *(float *)(&DAT_00157118 + generation * 4);
  }
  pTVar1 = TestRegistry::Instance();
  uVar3 = randomSeed & 0xffffffff;
  (pTVar1->m_generator)._M_x[0] = uVar3;
  lVar2 = 0x19;
  do {
    uVar3 = (ulong)((((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2) - 0x18);
    *(ulong *)(&(pTVar1->m_tests)._M_t._M_impl.field_0x0 + lVar2 * 8) = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x288);
  (pTVar1->m_generator)._M_p = 0x270;
  fVar4 = ::std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&pTVar1->m_generator);
  return fVar4 * 3.4028235e+38 + 1.1754944e-38;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();
          case 3:
            return std::numeric_limits<T>::lowest();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_real_distribution<T> dis(
                std::numeric_limits<T>::min(), std::numeric_limits<T>::max());
            return dis(gen);
          }
        }
      }